

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

char * embree::trimEnd(char *token)

{
  bool bVar1;
  char *pe;
  char *token_local;
  
  pe = token;
  if (*token != '\0') {
    for (; *pe != '\0'; pe = pe + 1) {
    }
    while( true ) {
      pe = pe + -1;
      if (((*pe == ' ') || (*pe == '\t')) || (bVar1 = false, *pe == '\r')) {
        bVar1 = token <= pe;
      }
      if (!bVar1) break;
      *pe = '\0';
    }
  }
  return token;
}

Assistant:

static inline const char* trimEnd(const char* token) 
  {
    if (*token == 0) return token;
    char* pe = (char*) token;
    while (*pe) pe++;
    pe--;
    while ((*pe == ' ' || *pe == '\t' || *pe == '\r') && pe >= token) *pe-- = 0;
    return token;
  }